

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_flushStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output)

{
  size_t sVar1;
  ZSTD_inBuffer input;
  
  inBuffer_forEndFlush((ZSTD_CStream *)input.pos);
  sVar1 = ZSTD_compressStream2
                    ((ZSTD_CCtx *)output,(ZSTD_outBuffer *)input.pos,(ZSTD_inBuffer *)input.size,
                     input.src._4_4_);
  return sVar1;
}

Assistant:

size_t ZSTD_flushStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output)
{
    ZSTD_inBuffer input = inBuffer_forEndFlush(zcs);
    input.size = input.pos; /* do not ingest more input during flush */
    return ZSTD_compressStream2(zcs, output, &input, ZSTD_e_flush);
}